

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigVec.c
# Opt level: O0

Fraig_NodeVec_t * Fraig_NodeVecAlloc(int nCap)

{
  Fraig_NodeVec_t *pFVar1;
  Fraig_Node_t **local_20;
  Fraig_NodeVec_t *p;
  int nCap_local;
  
  pFVar1 = (Fraig_NodeVec_t *)malloc(0x10);
  p._4_4_ = nCap;
  if ((0 < nCap) && (nCap < 8)) {
    p._4_4_ = 8;
  }
  pFVar1->nSize = 0;
  pFVar1->nCap = p._4_4_;
  if (pFVar1->nCap == 0) {
    local_20 = (Fraig_Node_t **)0x0;
  }
  else {
    local_20 = (Fraig_Node_t **)malloc((long)pFVar1->nCap << 3);
  }
  pFVar1->pArray = local_20;
  return pFVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates a vector with the given capacity.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Fraig_NodeVec_t * Fraig_NodeVecAlloc( int nCap )
{
    Fraig_NodeVec_t * p;
    p = ABC_ALLOC( Fraig_NodeVec_t, 1 );
    if ( nCap > 0 && nCap < 8 )
        nCap = 8;
    p->nSize  = 0;
    p->nCap   = nCap;
    p->pArray = p->nCap? ABC_ALLOC( Fraig_Node_t *, p->nCap ) : NULL;
    return p;
}